

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O2

void __thiscall
smf::MidiMessage::makeMts2_KeyTuningsByFrequency
          (MidiMessage *this,
          vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *mapping,
          int program)

{
  pointer ppVar1;
  long lVar2;
  int i;
  long lVar3;
  double dVar4;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> semimap;
  allocator_type local_41;
  _Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_40;
  
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&local_40,
             (long)(mapping->
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(mapping->
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4,&local_41);
  lVar2 = 0;
  for (lVar3 = 0;
      ppVar1 = (mapping->
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)
               ._M_impl.super__Vector_impl_data._M_start,
      lVar3 < (int)((ulong)((long)(mapping->
                                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) >> 4);
      lVar3 = lVar3 + 1) {
    *(undefined4 *)((long)&(local_40._M_impl.super__Vector_impl_data._M_start)->first + lVar2) =
         *(undefined4 *)((long)&ppVar1->first + lVar2);
    dVar4 = frequencyToSemitones(*(double *)((long)&ppVar1->second + lVar2),440.0);
    *(double *)((long)&(local_40._M_impl.super__Vector_impl_data._M_start)->second + lVar2) = dVar4;
    lVar2 = lVar2 + 0x10;
  }
  makeMts2_KeyTuningsBySemitone
            (this,(vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  &local_40,program);
  std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~_Vector_base
            (&local_40);
  return;
}

Assistant:

void MidiMessage::makeMts2_KeyTuningsByFrequency(std::vector<std::pair<int, double>>& mapping, int program) {
	std::vector<std::pair<int, double>> semimap(mapping.size());
	for (int i=0; i<(int)mapping.size(); i++) {
		semimap[i].first = mapping[i].first;
		semimap[i].second = MidiMessage::frequencyToSemitones(mapping[i].second);
	}
	this->makeMts2_KeyTuningsBySemitone(semimap, program);
}